

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Observer.cpp
# Opt level: O1

void * ObserverThread(void *pParam)

{
  interval **ppiVar1;
  double dVar2;
  int iVar3;
  char *pcVar4;
  FILE *pFVar5;
  interval *piVar6;
  double *pdVar7;
  vector<interval,_std::allocator<interval>_> *pvVar8;
  vector<interval,_std::allocator<interval>_> *this;
  double dVar9;
  double dVar10;
  double dVar11;
  box p;
  box Vr;
  box pdot;
  imatrix R_Euler;
  interval xhat_prev;
  interval yhat_prev;
  CHRONO chrono;
  CHRONO chrono_omegaz;
  CHRONO chrono_v;
  interval psihat_prev;
  interval zhat_prev;
  interval omegazhat_prev;
  interval vrxhat_prev;
  char logstatefilename [256];
  double local_8d0;
  double local_8c8;
  interval local_8a8;
  interval local_890;
  interval local_878;
  undefined1 local_860 [24];
  imatrix local_848;
  FILE *local_800;
  double local_7f8;
  double local_7f0;
  double local_7e8;
  double local_7e0;
  double local_7d8;
  double local_7d0;
  double local_7c8;
  double local_7c0;
  double local_7b8;
  double local_7b0;
  double local_7a8;
  double local_7a0;
  interval local_798;
  double local_780;
  interval local_778;
  interval local_760;
  interval local_748;
  interval local_730;
  timeval local_718;
  double local_708;
  double local_700;
  double local_6f8;
  double local_6f0;
  double local_6e8;
  double local_6e0;
  double local_6d8;
  double local_6d0;
  double local_6c8;
  double local_6c0;
  double local_6b8;
  double local_6b0;
  double local_6a8;
  double local_6a0;
  double local_698;
  double local_690;
  double local_688;
  double local_680;
  double local_678;
  double local_670;
  double local_668;
  double local_660;
  double local_658;
  double local_650;
  double local_648;
  double local_640;
  double local_638;
  double local_630;
  double local_628;
  double local_620;
  double local_618;
  double local_610;
  double local_608;
  double local_600;
  double local_5f8;
  double local_5f0;
  double local_5e8;
  double local_5e0;
  double local_5d8;
  double local_5d0;
  double local_5c8;
  double local_5c0;
  double local_5b8;
  double local_5b0;
  double local_5a8;
  double local_5a0;
  double local_598;
  double local_590;
  double local_588;
  double local_580;
  double local_578;
  double local_570;
  double local_568;
  double local_560;
  double local_558;
  double local_550;
  double local_548;
  double local_540;
  double local_538;
  double local_530;
  double local_528;
  double local_520;
  double local_518;
  interval local_510;
  timespec local_4f8;
  interval *local_4e8;
  interval **ppiStack_4e0;
  interval *local_4d8;
  interval **ppiStack_4d0;
  timespec local_4c8;
  int local_4b8;
  timespec local_4b0;
  interval *local_4a0;
  interval **ppiStack_498;
  interval *local_490;
  interval **ppiStack_488;
  timespec local_480;
  int local_470;
  timespec local_468;
  interval *local_458;
  interval **ppiStack_450;
  interval *local_448;
  interval **ppiStack_440;
  timespec local_438;
  int local_428;
  interval local_420;
  interval local_408;
  interval local_3f0;
  interval local_3d8;
  interval local_3c0;
  interval local_3a8;
  interval local_390;
  interval local_378;
  interval local_360;
  interval local_348;
  interval local_330;
  interval local_318;
  interval local_300;
  interval local_2e8;
  interval local_2d0;
  interval local_2b8;
  interval local_2a0;
  interval local_288;
  interval local_270;
  interval local_258;
  interval local_240;
  interval local_228;
  interval local_210;
  interval local_1f8;
  interval local_1e0;
  interval local_1c8;
  interval local_1b0;
  interval local_198;
  interval local_180;
  interval local_168;
  interval local_150;
  char local_138 [264];
  
  if (bDisablelogstate == 0) {
    pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
    pcVar4 = strtimeex_fns();
    sprintf(local_138,"log/logstate_%.64s.csv",pcVar4);
    pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
    pFVar5 = fopen(local_138,"w");
    if (pFVar5 == (FILE *)0x0) {
      puts("Unable to create log file.");
      goto LAB_0010b22a;
    }
    fwrite("t_epoch (in s);lat;lon;alt_amsl;hdg;cog;sog;alt_agl;pressure (in bar);fluiddira (in deg);fluidspeeda;fluiddir (in deg);fluidspeed;range;bearing (in deg);elevation (in deg);utc (in ms);t_app (in s);xhat;yhat;zhat;phihat;thetahat;psihat;vrxhat;vryhat;vrzhat;omegaxhat;omegayhat;omegazhat;accrxhat;accryhat;accrzhat;xhat_err;yhat_err;zhat_err;phihat_err;thetahat_err;psihat_err;vrxhat_err;vryhat_err;vrzhat_err;omegaxhat_err;omegayhat_err;omegazhat_err;accrxhat_err;accryhat_err;accrzhat_err;wx;wy;wz;wphi;wtheta;wpsi;wd;wu;wagl;uvx;uvy;uvz;uwx;uwy;uwz;u1;u2;u3;u4;u5;u6;u7;u8;u9;u10;u11;u12;u13;u14;EPU1;EPU2;\n"
           ,0x260,1,pFVar5);
    local_800 = pFVar5;
    fflush(pFVar5);
  }
  else {
    local_800 = (FILE *)0x0;
  }
  pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
  psitwind = psitwind_med;
  vtwind = vtwind_med;
  local_7f0 = cos(psitwind_med);
  local_780 = sin(psitwind);
  dVar10 = atan2(local_780,local_7f0);
  dVar10 = fmod(dVar10,6.283185307179586);
  local_730.inf = fmod(dVar10 + 9.42477796076938,6.283185307179586);
  local_730.inf = local_730.inf + -3.141592653589793;
  interval::interval((interval *)&local_848,&local_730.inf);
  interval::operator=((interval *)&psitwindhat,(interval *)&local_848);
  interval::interval((interval *)&local_848,&vtwind);
  interval::operator=((interval *)&vtwindhat,(interval *)&local_848);
  pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
  bGPSLocalization = 1;
  bDVLLocalization = 1;
  iVar3 = clock_getres(4,&local_4c8);
  if ((iVar3 == 0) && (iVar3 = clock_gettime(4,&local_4f8), iVar3 == 0)) {
    local_4b8 = 0;
    local_4e8 = (interval *)0x0;
    ppiStack_4e0 = (interval **)0x0;
    local_4d8 = (interval *)0x0;
    ppiStack_4d0 = (interval **)0x0;
  }
  iVar3 = clock_getres(4,&local_438);
  if ((iVar3 == 0) && (iVar3 = clock_gettime(4,&local_468), iVar3 == 0)) {
    local_428 = 0;
    local_458 = (interval *)0x0;
    ppiStack_450 = (interval **)0x0;
    local_448 = (interval *)0x0;
    ppiStack_440 = (interval **)0x0;
  }
  iVar3 = clock_getres(4,&local_480);
  if ((iVar3 == 0) && (iVar3 = clock_gettime(4,&local_4b0), iVar3 == 0)) {
    local_470 = 0;
    local_4a0 = (interval *)0x0;
    ppiStack_498 = (interval **)0x0;
    local_490 = (interval *)0x0;
    ppiStack_488 = (interval **)0x0;
  }
  local_8d0 = 0.0;
  do {
    local_848.data.data_.v_.data_ = (interval *)(((long)observerperiod * 1000) / 1000000);
    local_848.data.data_.v_.ref_count_ = (int *)((((long)observerperiod * 1000) % 1000000) * 1000);
    nanosleep((timespec *)&local_848,(timespec *)0x0);
    piVar6 = local_4d8;
    ppiVar1 = ppiStack_4d0;
    if (local_4b8 == 0) {
      iVar3 = clock_gettime(4,(timespec *)&local_848);
      local_7e8 = local_8d0;
      if (iVar3 == 0) {
        local_848.data.data_.v_.data_ =
             (interval *)
             ((long)local_4d8 +
             (long)&(local_848.data.data_.v_.data_)->inf +
             (((long)local_848.data.data_.v_.ref_count_ + (long)ppiStack_4d0) / 1000000000 -
             local_4f8.tv_sec));
        local_848.data.data_.v_.ref_count_ =
             (int *)(((long)local_848.data.data_.v_.ref_count_ + (long)ppiStack_4d0) % 1000000000 -
                    local_4f8.tv_nsec);
        piVar6 = local_848.data.data_.v_.data_;
        ppiVar1 = (interval **)local_848.data.data_.v_.ref_count_;
        if ((long)local_848.data.data_.v_.ref_count_ < 0) {
          local_848.data.data_.v_.data_ =
               (interval *)
               ((long)local_848.data.data_.v_.data_ +
               (long)local_848.data.data_.v_.ref_count_ / 1000000000 + -1);
          local_848.data.data_.v_.ref_count_ =
               (int *)((long)local_848.data.data_.v_.ref_count_ % 1000000000 + 1000000000);
          piVar6 = local_848.data.data_.v_.data_;
          ppiVar1 = (interval **)local_848.data.data_.v_.ref_count_;
        }
        goto LAB_001081c3;
      }
    }
    else {
LAB_001081c3:
      local_7e8 = (double)(long)ppiVar1 / 1000000000.0 + (double)(long)piVar6;
    }
    iVar3 = gettimeofday(&local_718,(__timezone_ptr_t)0x0);
    if (iVar3 != 0) {
      local_718.tv_sec = 0;
      local_718.tv_usec = 0;
    }
    local_7c0 = (double)local_718.tv_sec;
    local_7a0 = (double)local_718.tv_usec * 1e-06;
    pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
    interval::interval(&local_730,(interval *)&xhat);
    interval::interval(&local_510,(interval *)&yhat);
    interval::interval(&local_378,(interval *)&zhat);
    interval::interval(&local_390,(interval *)&psihat);
    interval::interval(&local_150,(interval *)&vrxhat);
    interval::interval(&local_168,(interval *)&omegazhat);
    local_878.inf = vc_med - vc_var;
    local_860._0_8_ = vc_med + vc_var;
    interval::interval((interval *)&local_848,&local_878.inf,(double *)local_860);
    interval::operator=((interval *)&vchat,(interval *)&local_848);
    local_878.inf = psic_med - psic_var;
    local_860._0_8_ = psic_med + psic_var;
    interval::interval((interval *)&local_848,&local_878.inf,(double *)local_860);
    interval::operator=((interval *)&psichat,(interval *)&local_848);
    local_878.inf = -hw_var;
    interval::interval((interval *)&local_848,&local_878.inf,&hw_var);
    interval::operator=((interval *)&hwhat,(interval *)&local_848);
    dVar9 = wind_filter_coef;
    dVar10 = 1.0 - wind_filter_coef;
    dVar11 = cos(psitwind);
    dVar2 = wind_filter_coef;
    local_7f0 = local_7f0 * dVar9 + dVar11 * dVar10;
    dVar10 = 1.0 - wind_filter_coef;
    dVar11 = sin(psitwind);
    local_780 = local_780 * dVar2 + dVar11 * dVar10;
    dVar10 = atan2(local_780,local_7f0);
    dVar10 = fmod(dVar10,6.283185307179586);
    local_890.inf = fmod(dVar10 + 9.42477796076938,6.283185307179586);
    local_890.inf = local_890.inf + -3.141592653589793;
    interval::interval(&local_878,&local_890.inf);
    local_8a8.inf = -psitwind_var;
    interval::interval((interval *)local_860,&local_8a8.inf,&psitwind_var);
    operator+(&local_878,(interval *)local_860);
    interval::operator=((interval *)&psitwindhat,(interval *)&local_848);
    dVar11 = wind_filter_coef;
    dVar10 = Center((interval *)&vtwindhat);
    local_890.inf = dVar10 * dVar11 + (1.0 - wind_filter_coef) * vtwind;
    interval::interval(&local_878,&local_890.inf);
    local_8a8.inf = -vtwind_var;
    interval::interval((interval *)local_860,&local_8a8.inf,&vtwind_var);
    operator+(&local_878,(interval *)local_860);
    interval::operator=((interval *)&vtwindhat,(interval *)&local_848);
    if (psi_source == 1) {
      pvVar8 = &psi_ahrs;
      if (GPS_SOG_for_valid_COG <= sog) {
        pvVar8 = &cog_gps;
      }
    }
    else {
      pvVar8 = &psi_ahrs;
      if ((psi_source == 2) && (pvVar8 = &psi_ahrs, GPS_SOG_for_valid_COG <= sog)) {
        pvVar8 = &psi_dvl;
      }
    }
    local_8d0 = local_7e8 - local_8d0;
    interval::operator=((interval *)&psihat,(interval *)pvVar8);
    interval::operator=((interval *)&omegaxhat,(interval *)&omegax_ahrs);
    interval::operator=((interval *)&omegayhat,(interval *)&omegay_ahrs);
    interval::operator=((interval *)&accrxhat,(interval *)&accrx_ahrs);
    interval::operator=((interval *)&accryhat,(interval *)&accry_ahrs);
    interval::operator=((interval *)&accrzhat,(interval *)&accrz_ahrs);
    if ((char)robid == '\0') {
      if (robid < 0x20000) {
LAB_00108c60:
        interval::operator=((interval *)&xhat,(interval *)&x_gps);
        interval::operator=((interval *)&yhat,(interval *)&y_gps);
        interval::operator=((interval *)&zhat,(interval *)&z_gps);
        interval::operator=((interval *)&phihat,(interval *)&phi_ahrs);
        interval::operator=((interval *)&thetahat,(interval *)&theta_ahrs);
        operator-((interval *)&xhat,&local_730);
        dVar10 = Center((interval *)local_860);
        operator-((interval *)&yhat,&local_510);
        dVar11 = Center(&local_890);
        dVar10 = dVar11 * dVar11 + dVar10 * dVar10;
        if (dVar10 < 0.0) {
          dVar10 = sqrt(dVar10);
        }
        else {
          dVar10 = SQRT(dVar10);
        }
        local_8a8.inf = dVar10 / local_8d0;
        interval::interval(&local_878,&local_8a8.inf);
        operator+(&local_878,(interval *)&vrxdotnoise);
        interval::operator=((interval *)&vrxhat,(interval *)&local_848);
        this = &omegazhat;
        pvVar8 = &omegaz_ahrs;
LAB_00109382:
        interval::operator=((interval *)this,(interval *)pvVar8);
      }
      else {
        if (robid < 0x200000) {
          if (robid != 0x20000) {
            if (robid == 0x100000) goto LAB_00109992;
            goto LAB_00108c60;
          }
          operator*(&local_8a8,(interval *)&alphavrxhat,u1 + u2);
          Cos(&local_798,(interval *)&psihat);
          operator*(&local_8a8,&local_798);
          operator+(&local_890,(interval *)&xdotnoise);
          operator*(&local_878,local_8d0,(interval *)local_860);
          operator+((interval *)&xhat,&local_878);
          interval::operator=((interval *)&xhat,(interval *)&local_848);
          operator*(&local_8a8,(interval *)&alphavrxhat,u1 + u2);
          Sin(&local_798,(interval *)&psihat);
          operator*(&local_8a8,&local_798);
          operator+(&local_890,(interval *)&ydotnoise);
LAB_0010acd1:
          operator*(&local_878,local_8d0,(interval *)local_860);
          operator+((interval *)&yhat,&local_878);
          interval::operator=((interval *)&yhat,(interval *)&local_848);
          local_878.inf = GPS_low_acc * -5.0;
          local_860._0_8_ = GPS_low_acc * 5.0;
          interval::interval((interval *)&local_848,&local_878.inf,(double *)local_860);
          interval::operator=((interval *)&zhat,(interval *)&local_848);
          interval::operator=((interval *)&phihat,(interval *)&phi_ahrs);
          interval::operator=((interval *)&thetahat,(interval *)&theta_ahrs);
          operator-((interval *)&xhat,&local_730);
          dVar10 = Center((interval *)local_860);
          operator-((interval *)&yhat,&local_510);
          dVar11 = Center(&local_890);
          dVar10 = dVar11 * dVar11 + dVar10 * dVar10;
          if (dVar10 < 0.0) {
            dVar10 = sqrt(dVar10);
          }
          else {
            dVar10 = SQRT(dVar10);
          }
          local_8a8.inf = dVar10 / local_8d0;
          interval::interval(&local_878,&local_8a8.inf);
          operator+(&local_878,(interval *)&vrxdotnoise);
          interval::operator=((interval *)&vrxhat,(interval *)&local_848);
          interval::operator=((interval *)&omegazhat,(interval *)&omegaz_ahrs);
        }
        else {
          if (robid == 0x200000) {
LAB_00109992:
            operator*(&local_798,(interval *)&alphavrxhat,u_f);
            Cos(&local_760,(interval *)&psihat);
            operator*(&local_798,&local_760);
            operator*(&local_748,(interval *)&alphaomegazhat,uw_f);
            Cos(&local_778,&local_748);
            operator*(&local_8a8,&local_778);
            operator+(&local_890,(interval *)&xdotnoise);
            operator*(&local_878,local_8d0,(interval *)local_860);
            operator+((interval *)&xhat,&local_878);
            interval::operator=((interval *)&xhat,(interval *)&local_848);
            operator*(&local_798,(interval *)&alphavrxhat,u_f);
            Sin(&local_760,(interval *)&psihat);
            operator*(&local_798,&local_760);
            operator*(&local_748,(interval *)&alphaomegazhat,uw_f);
            Cos(&local_778,&local_748);
            operator*(&local_8a8,&local_778);
            operator+(&local_890,(interval *)&ydotnoise);
            goto LAB_0010acd1;
          }
          if (robid != 0x4000000) goto LAB_00108c60;
          interval::operator=((interval *)&vrxhat,(interval *)&vrx_of);
          interval::operator=((interval *)&vryhat,(interval *)&vry_of);
          Cos(&local_798,(interval *)&psihat);
          operator*((interval *)&vrx_of,&local_798);
          Sin(&local_778,(interval *)&psihat);
          operator*((interval *)&vry_of,&local_778);
          operator-(&local_8a8,&local_760);
          operator+(&local_890,(interval *)&xdotnoise);
          operator*(&local_878,local_8d0,(interval *)local_860);
          operator+((interval *)&xhat,&local_878);
          interval::operator=((interval *)&xhat,(interval *)&local_848);
          Sin(&local_798,(interval *)&psihat);
          operator*((interval *)&vrx_of,&local_798);
          Cos(&local_778,(interval *)&psihat);
          operator*((interval *)&vry_of,&local_778);
          operator+(&local_8a8,&local_760);
          operator+(&local_890,(interval *)&ydotnoise);
          operator*(&local_878,local_8d0,(interval *)local_860);
          operator+((interval *)&yhat,&local_878);
          interval::operator=((interval *)&yhat,(interval *)&local_848);
          local_878.inf = GPS_low_acc * -5.0;
          local_860._0_8_ = GPS_low_acc * 5.0;
          interval::interval((interval *)&local_848,&local_878.inf,(double *)local_860);
          interval::operator=((interval *)&zhat,(interval *)&local_848);
          interval::operator=((interval *)&phihat,(interval *)&phi_ahrs);
          interval::operator=((interval *)&thetahat,(interval *)&theta_ahrs);
          operator-((interval *)&zhat,&local_378);
          local_890.inf = Center((interval *)local_860);
          local_890.inf = local_890.inf / local_8d0;
          interval::interval(&local_878,&local_890.inf);
          operator+(&local_878,(interval *)&vrzdotnoise);
          interval::operator=((interval *)&vrzhat,(interval *)&local_848);
          interval::operator=((interval *)&omegazhat,(interval *)&omegaz_ahrs);
        }
        if ((bGPSLocalization != 0) && (iVar3 = GetGNSSlevel(), 0 < iVar3)) {
          operator&((interval *)&local_848,(interval *)&xhat,(interval *)&x_gps);
          interval::operator=((interval *)&xhat,(interval *)&local_848);
          operator&((interval *)&local_848,(interval *)&yhat,(interval *)&y_gps);
          interval::operator=((interval *)&yhat,(interval *)&local_848);
          operator&((interval *)&local_848,(interval *)&zhat,(interval *)&z_gps);
          interval::operator=((interval *)&zhat,(interval *)&local_848);
          if (((char)xhat.super__Vector_base<interval,_std::allocator<interval>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage != '\0') ||
             ((char)yhat.super__Vector_base<interval,_std::allocator<interval>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage == '\x01')) {
            interval::operator=((interval *)&xhat,(interval *)&x_gps);
            interval::operator=((interval *)&yhat,(interval *)&y_gps);
          }
          if ((char)zhat.super__Vector_base<interval,_std::allocator<interval>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage == '\x01') {
            this = &zhat;
            pvVar8 = &z_gps;
            goto LAB_00109382;
          }
        }
      }
    }
    else {
      if (((bDVLLocalization == 0) || (dVar10 = Width((interval *)&vrx_dvl), dvl_acc * 4.0 < dVar10)
          ) || (dVar10 = Width((interval *)&vry_dvl), dvl_acc * 4.0 < dVar10)) {
        Cos(&local_798,(interval *)&psihat);
        operator*((interval *)&vrxhat,&local_798);
        Cos(&local_778,(interval *)&psichat);
        operator*((interval *)&vchat,&local_778);
        operator+(&local_8a8,&local_760);
        operator+(&local_890,(interval *)&xdotnoise);
        operator*(&local_878,local_8d0,(interval *)local_860);
        operator+((interval *)&xhat,&local_878);
        interval::operator=((interval *)&xhat,(interval *)&local_848);
        Sin(&local_798,(interval *)&psihat);
        operator*((interval *)&vrxhat,&local_798);
        Sin(&local_778,(interval *)&psichat);
        operator*((interval *)&vchat,&local_778);
        operator+(&local_8a8,&local_760);
        operator+(&local_890,(interval *)&ydotnoise);
        operator*(&local_878,local_8d0,(interval *)local_860);
        operator+((interval *)&yhat,&local_878);
        interval::operator=((interval *)&yhat,(interval *)&local_848);
        operator+((interval *)&z_pressure,(interval *)&hwhat);
        interval::operator=((interval *)&zhat,(interval *)&local_848);
        interval::operator=((interval *)&phihat,(interval *)&phi_ahrs);
        interval::operator=((interval *)&thetahat,(interval *)&theta_ahrs);
        local_748.inf = 1.0;
        interval::interval(&local_8a8,&local_748.inf);
        operator*(&local_798,local_8d0,(interval *)&alphafvrxhat);
        operator-(&local_8a8,&local_798);
        operator*(&local_890,(interval *)&vrxhat);
        operator*(&local_760,(u1 + u2) * local_8d0,(interval *)&alphavrxhat);
        operator+((interval *)local_860,&local_760);
        operator*(&local_778,local_8d0,(interval *)&vrxdotnoise);
        operator+(&local_878,&local_778);
        interval::operator=((interval *)&vrxhat,(interval *)&local_848);
      }
      else {
        interval::operator=((interval *)&vrxhat,(interval *)&vrx_dvl);
        interval::operator=((interval *)&vryhat,(interval *)&vry_dvl);
        interval::operator=((interval *)&vrzhat,(interval *)&vrz_dvl);
        operator+((interval *)&z_pressure,(interval *)&hwhat);
        interval::operator=((interval *)&zhat,(interval *)&local_848);
        interval::operator=((interval *)&phihat,(interval *)&phi_ahrs);
        interval::operator=((interval *)&thetahat,(interval *)&theta_ahrs);
        RotationPhiThetaPsi(&local_848,(interval *)&phihat,(interval *)&thetahat,(interval *)&psihat
                           );
        interval::interval(&local_3a8,(interval *)&vrxhat);
        interval::interval(&local_3c0,(interval *)&vryhat);
        interval::interval(&local_3d8,(interval *)&vrzhat);
        box::box((box *)&local_878,(vector<interval,_std::allocator<interval>_> *)&local_3a8,
                 (vector<interval,_std::allocator<interval>_> *)&local_3c0,
                 (vector<interval,_std::allocator<interval>_> *)&local_3d8);
        operator*((imatrix *)local_860,(box *)&local_848);
        interval::interval(&local_3f0,(interval *)&xhat);
        interval::interval(&local_408,(interval *)&yhat);
        interval::interval(&local_420,(interval *)&zhat);
        box::box((box *)&local_890,(vector<interval,_std::allocator<interval>_> *)&local_3f0,
                 (vector<interval,_std::allocator<interval>_> *)&local_408,
                 (vector<interval,_std::allocator<interval>_> *)&local_420);
        operator*(local_8d0,(box *)&local_798);
        operator+((box *)&local_8a8,(box *)&local_890);
        box::operator=((box *)&local_890,(box *)&local_8a8);
        box::~box((box *)&local_8a8);
        box::~box((box *)&local_798);
        piVar6 = box::operator[]((box *)&local_890,1);
        interval::operator=((interval *)&xhat,piVar6);
        piVar6 = box::operator[]((box *)&local_890,2);
        interval::operator=((interval *)&yhat,piVar6);
        box::~box((box *)&local_890);
        box::~box((box *)local_860);
        box::~box((box *)&local_878);
        imatrix::~imatrix(&local_848);
      }
      if ((robid & 0xeU) == 0) {
        if (robid == 1) {
          operator*((interval *)local_860,u1 - u2,(interval *)&alphaomegazhat);
          operator+((interval *)local_860,(interval *)&psidotnoise);
          pvVar8 = (vector<interval,_std::allocator<interval>_> *)&local_848;
          operator*((interval *)pvVar8,local_8d0,&local_878);
        }
        else {
          if ((robid == 0x80) || (robid == 0x40)) goto LAB_00108a0a;
          operator*(&local_878,0.8,(interval *)&omegazhat);
          dVar10 = Center((interval *)&psihat);
          dVar11 = Center(&local_390);
          local_760.inf = sin(dVar10 - dVar11);
          local_760.inf = local_760.inf / local_8d0;
          interval::interval(&local_8a8,&local_760.inf);
          local_748.inf = omegaz_ahrs_acc;
          local_778.inf = -omegaz_ahrs_acc;
          interval::interval(&local_798,&local_778.inf,&local_748.inf);
          operator+(&local_8a8,&local_798);
          operator*((interval *)local_860,0.2,&local_890);
          pvVar8 = (vector<interval,_std::allocator<interval>_> *)&local_848;
          operator+(&local_878,(interval *)local_860);
        }
      }
      else {
LAB_00108a0a:
        pvVar8 = &omegaz_ahrs;
      }
      interval::operator=((interval *)&omegazhat,(interval *)pvVar8);
      if (((bGPSLocalization != 0) && (iVar3 = GetGNSSlevel(), 0 < iVar3)) &&
         (dVar10 = Center((interval *)&zhat), GPS_submarine_depth_limit < dVar10)) {
        operator&((interval *)&local_848,(interval *)&xhat,(interval *)&x_gps);
        interval::operator=((interval *)&xhat,(interval *)&local_848);
        operator&((interval *)&local_848,(interval *)&yhat,(interval *)&y_gps);
        interval::operator=((interval *)&yhat,(interval *)&local_848);
        if (((char)xhat.super__Vector_base<interval,_std::allocator<interval>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage != '\0') ||
           ((char)yhat.super__Vector_base<interval,_std::allocator<interval>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage == '\x01')) {
          interval::operator=((interval *)&xhat,(interval *)&x_gps);
          this = &yhat;
          pvVar8 = &y_gps;
          goto LAB_00109382;
        }
      }
    }
    local_7b0 = lat_env;
    local_7d0 = long_env;
    local_7a8 = alt_env;
    dVar11 = (double)CONCAT44(angle_env._4_4_,angle_env._0_4_);
    local_7f8 = Center((interval *)&xhat);
    local_7b8 = Center((interval *)&yhat);
    local_7c8 = Center((interval *)&zhat);
    local_7d8 = cos(dVar11);
    local_7e0 = sin(dVar11);
    dVar10 = sin(dVar11);
    dVar11 = cos(dVar11);
    dVar10 = ((dVar10 * local_7f8 + dVar11 * local_7b8) / 6371000.0) * 57.29577951308232 + local_7b0
    ;
    dVar11 = 0.0;
    if ((2.220446049250313e-16 <= ABS(dVar10 + -90.0)) &&
       (2.220446049250313e-16 <= ABS(dVar10 + 90.0))) {
      local_7f8 = ((local_7f8 * local_7d8 - local_7b8 * local_7e0) / 6371000.0) * 57.29577951308232;
      dVar11 = cos(dVar10 * 0.017453292519943295);
      dVar11 = local_7d0 + local_7f8 / dVar11;
    }
    dVar9 = (double)CONCAT44(angle_env._4_4_,angle_env._0_4_);
    local_7f8 = dVar11;
    dVar11 = Center((interval *)&psihat);
    dVar11 = fmod((((-dVar9 - dVar11) + 1.5707963267948966) * 180.0) / 3.141592653589793,360.0);
    local_7b0 = fmod(dVar11 + 360.0,360.0);
    local_8c8 = -(double)CONCAT44(angle_env._4_4_,angle_env._0_4_);
    dVar11 = Center((interval *)&cog_gps);
    dVar11 = fmod((((local_8c8 - dVar11) + 1.5707963267948966) * 180.0) / 3.141592653589793,360.0);
    dVar11 = fmod(dVar11 + 360.0,360.0);
    if (robid < 0x2000) {
      if (robid < 0x100) {
        if ((0x20 < (uint)robid) || ((0x100000016U >> ((ulong)(uint)robid & 0x3f) & 1) == 0))
        goto LAB_00109b5e;
        EPU1 = ((double)(~-(ulong)(vbat1 != 0.0) & (ulong)P_electronics_4 |
                        (ulong)(vbat1_filtered * ibat1_filtered) & -(ulong)(vbat1 != 0.0)) *
               local_8d0) / 3600.0 + EPU1;
        if ((vbat2 != 0.0) || (NAN(vbat2))) goto LAB_00109977;
        pdVar7 = &u3;
        dVar9 = u1 + u2;
LAB_00109c07:
        dVar9 = (dVar9 + *pdVar7) * P_actuators_1;
      }
      else {
        if (0x3ff < robid) {
          if (robid == 0x400) goto LAB_001098fa;
          if (robid == 0x1000) goto LAB_00109869;
LAB_00109b5e:
          EPU1 = ((double)(~-(ulong)(vbat1 != 0.0) & (ulong)P_electronics_4 |
                          (ulong)(vbat1_filtered * ibat1_filtered) & -(ulong)(vbat1 != 0.0)) *
                 local_8d0) / 3600.0 + EPU1;
          if ((vbat2 != 0.0) || (NAN(vbat2))) goto LAB_00109977;
          pdVar7 = &ul_f;
          dVar9 = u_f + uw_f + uv_f;
          goto LAB_00109c07;
        }
        if (robid != 0x100) {
          if (robid == 0x200) goto LAB_00109782;
          goto LAB_00109b5e;
        }
LAB_001098fa:
        EPU1 = ((double)(~-(ulong)(vbat1 != 0.0) & (ulong)P_electronics_4 |
                        (ulong)(vbat1_filtered * ibat1_filtered) & -(ulong)(vbat1 != 0.0)) *
               local_8d0) / 3600.0 + EPU1;
        if ((vbat2 != 0.0) || (NAN(vbat2))) goto LAB_00109977;
        dVar9 = u_f * P_actuators_1 + uw_f * P_actuators_2;
      }
      dVar9 = dVar9 + P_actuators_4;
LAB_00109c25:
      EPU2 = (local_8d0 * dVar9) / 3600.0 + EPU2;
    }
    else {
      if (0xffff < robid) {
        if (0xfffff < robid) {
          if ((robid == 0x100000) || (robid == 0x200000)) goto LAB_001098fa;
          goto LAB_00109b5e;
        }
        if ((robid != 0x10000) && (robid != 0x20000)) goto LAB_00109b5e;
LAB_00109782:
        EPU1 = ((double)(~-(ulong)(vbat1 != 0.0) & (ulong)P_electronics_4 |
                        (ulong)(vbat1_filtered * ibat1_filtered) & -(ulong)(vbat1 != 0.0)) *
               local_8d0) / 3600.0 + EPU1;
        if ((vbat2 == 0.0) && (!NAN(vbat2))) {
          pdVar7 = &u2;
          dVar9 = u1;
          goto LAB_00109c07;
        }
LAB_00109977:
        dVar9 = vbat2_filtered * ibat2_filtered;
        goto LAB_00109c25;
      }
      if (robid != 0x2000) {
        if ((robid != 0x4000) && (robid != 0x8000)) goto LAB_00109b5e;
LAB_00109869:
        EPU1 = ((double)(~-(ulong)(vbat1 != 0.0) & (ulong)P_electronics_4 |
                        (ulong)(vbat1_filtered * ibat1_filtered) & -(ulong)(vbat1 != 0.0)) *
               local_8d0) / 3600.0 + EPU1;
        if ((vbat2 != 0.0) || (dVar9 = P_actuators_4, NAN(vbat2))) goto LAB_00109977;
        goto LAB_00109c25;
      }
      if ((vbat1 != 0.0) || (NAN(vbat1))) {
        dVar9 = vbat1_filtered * ibat1_filtered;
      }
      else {
        dVar9 = P_electronics_4 + P_actuators_4;
      }
      EPU1 = EPU1 + (local_8d0 * dVar9) / 3600.0;
    }
    if (robid < 0x2000) {
      if ((robid == 0x200) || (robid == 0x400)) goto LAB_00109c6b;
    }
    else if ((robid == 0x2000) || ((robid == 0x8000 || (robid == 0x4000)))) {
LAB_00109c6b:
      dVar9 = fmod(((1.5707963267948966 - psiawind) * 180.0) / 3.141592653589793,360.0);
      dVar9 = fmod(dVar9 + 540.0,360.0);
      fluiddira = dVar9 + -180.0;
      fluidspeeda = vawind;
      dVar9 = Center((interval *)&psitwindhat);
      dVar9 = fmod(((1.5707963267948966 - dVar9) * 180.0) / 3.141592653589793,360.0);
      dVar9 = fmod(dVar9 + 540.0,360.0);
      fluiddir = dVar9 + -180.0;
      fluidspeed = Center((interval *)&vtwindhat);
    }
    dVar9 = sog;
    if (local_800 != (FILE *)0x0) {
      local_7a0 = local_7a0 + local_7c0;
      local_7a8 = local_7a8 + local_7c8;
      local_7b8 = altitude_AGL;
      local_7c0 = pressure_mes;
      local_7c8 = fluiddira;
      local_7d0 = fluidspeeda;
      local_7d8 = fluiddir;
      local_7e0 = fluidspeed;
      local_590 = d_mes;
      dVar2 = fmod((alpha_mes * 180.0) / 3.141592653589793,360.0);
      local_598 = fmod(dVar2 + 540.0,360.0);
      local_598 = local_598 + -180.0;
      local_5a0 = utc;
      local_5a8 = Center((interval *)&xhat);
      local_5b0 = Center((interval *)&yhat);
      local_5b8 = Center((interval *)&zhat);
      local_5c0 = Center((interval *)&phihat);
      local_5c8 = Center((interval *)&thetahat);
      local_5d0 = Center((interval *)&psihat);
      local_5d8 = Center((interval *)&vrxhat);
      local_5e0 = Center((interval *)&vryhat);
      local_5e8 = Center((interval *)&vrzhat);
      local_5f0 = Center((interval *)&omegaxhat);
      local_5f8 = Center((interval *)&omegayhat);
      local_600 = Center((interval *)&omegazhat);
      local_608 = Center((interval *)&accrxhat);
      local_610 = Center((interval *)&accryhat);
      local_618 = Center((interval *)&accrzhat);
      local_518 = 2.0;
      interval::interval(&local_878,&local_518);
      operator/((interval *)&xhat,&local_878);
      local_620 = Width((interval *)&local_848);
      local_520 = 2.0;
      interval::interval(&local_890,&local_520);
      operator/((interval *)&yhat,&local_890);
      local_628 = Width((interval *)local_860);
      local_528 = 2.0;
      interval::interval(&local_798,&local_528);
      operator/((interval *)&zhat,&local_798);
      local_630 = Width(&local_8a8);
      local_530 = 2.0;
      interval::interval(&local_778,&local_530);
      operator/((interval *)&phihat,&local_778);
      local_638 = Width(&local_760);
      local_538 = 2.0;
      interval::interval(&local_180,&local_538);
      operator/((interval *)&thetahat,&local_180);
      local_640 = Width(&local_748);
      local_540 = 2.0;
      interval::interval(&local_1b0,&local_540);
      operator/((interval *)&psihat,&local_1b0);
      local_648 = Width(&local_198);
      local_548 = 2.0;
      interval::interval(&local_1e0,&local_548);
      operator/((interval *)&vrxhat,&local_1e0);
      local_650 = Width(&local_1c8);
      local_550 = 2.0;
      interval::interval(&local_210,&local_550);
      operator/((interval *)&vryhat,&local_210);
      local_658 = Width(&local_1f8);
      local_558 = 2.0;
      interval::interval(&local_240,&local_558);
      operator/((interval *)&vrzhat,&local_240);
      local_660 = Width(&local_228);
      local_560 = 2.0;
      interval::interval(&local_270,&local_560);
      operator/((interval *)&omegaxhat,&local_270);
      local_668 = Width(&local_258);
      local_568 = 2.0;
      interval::interval(&local_2a0,&local_568);
      operator/((interval *)&omegayhat,&local_2a0);
      local_670 = Width(&local_288);
      local_570 = 2.0;
      interval::interval(&local_2d0,&local_570);
      operator/((interval *)&omegazhat,&local_2d0);
      local_678 = Width(&local_2b8);
      local_578 = 2.0;
      interval::interval(&local_300,&local_578);
      operator/((interval *)&accrxhat,&local_300);
      local_680 = Width(&local_2e8);
      local_580 = 2.0;
      interval::interval(&local_330,&local_580);
      operator/((interval *)&accryhat,&local_330);
      local_688 = Width(&local_318);
      local_588 = 2.0;
      interval::interval(&local_360,&local_588);
      operator/((interval *)&accrzhat,&local_360);
      local_690 = Width(&local_348);
      pFVar5 = local_800;
      local_698 = wx;
      local_6a0 = wy;
      local_6a8 = wz;
      local_6b0 = wphi;
      local_6b8 = wtheta;
      local_6c0 = wpsi;
      local_6c8 = wd;
      local_6d0 = wu;
      local_6d8 = wagl;
      local_6e0 = u_f;
      local_6e8 = ul_f;
      local_6f0 = uv_f;
      local_6f8 = ur_f;
      local_700 = up_f;
      local_708 = uw_f;
      fprintf(local_800,
              "%f;%.8f;%.8f;%.3f;%.2f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%.3f;%.3f;%.3f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%.3f;%.3f;%.3f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%.3f;%.3f;\n"
              ,SUB84(local_7a0,0),dVar10,local_7f8,local_7a8,local_7b0,dVar11,dVar9,local_7b8);
      fflush(pFVar5);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
    local_8d0 = local_7e8;
  } while (bExit == 0);
  if (local_470 == 0) {
    clock_gettime(4,(timespec *)&local_848);
    local_4a0 = local_848.data.data_.v_.data_;
    ppiStack_498 = (interval **)local_848.data.data_.v_.ref_count_;
    local_848.data.data_.v_.data_ =
         (interval *)
         ((long)local_490 +
         (long)&(local_848.data.data_.v_.data_)->inf +
         (((long)local_848.data.data_.v_.ref_count_ + (long)ppiStack_488) / 1000000000 -
         local_4b0.tv_sec));
    local_848.data.data_.v_.ref_count_ =
         (int *)(((long)local_848.data.data_.v_.ref_count_ + (long)ppiStack_488) % 1000000000 -
                local_4b0.tv_nsec);
    if ((long)local_848.data.data_.v_.ref_count_ < 0) {
      local_848.data.data_.v_.data_ =
           (interval *)
           ((long)local_848.data.data_.v_.data_ +
           (long)local_848.data.data_.v_.ref_count_ / 1000000000 + -1);
      local_848.data.data_.v_.ref_count_ =
           (int *)((long)local_848.data.data_.v_.ref_count_ % 1000000000 + 1000000000);
    }
    local_490 = local_848.data.data_.v_.data_;
    ppiStack_488 = (interval **)local_848.data.data_.v_.ref_count_;
  }
  if (local_428 == 0) {
    clock_gettime(4,(timespec *)&local_848);
    local_458 = local_848.data.data_.v_.data_;
    ppiStack_450 = (interval **)local_848.data.data_.v_.ref_count_;
    local_848.data.data_.v_.data_ =
         (interval *)
         ((long)local_448 +
         (long)&(local_848.data.data_.v_.data_)->inf +
         (((long)local_848.data.data_.v_.ref_count_ + (long)ppiStack_440) / 1000000000 -
         local_468.tv_sec));
    local_848.data.data_.v_.ref_count_ =
         (int *)(((long)local_848.data.data_.v_.ref_count_ + (long)ppiStack_440) % 1000000000 -
                local_468.tv_nsec);
    if ((long)local_848.data.data_.v_.ref_count_ < 0) {
      local_848.data.data_.v_.data_ =
           (interval *)
           ((long)local_848.data.data_.v_.data_ +
           (long)local_848.data.data_.v_.ref_count_ / 1000000000 + -1);
      local_848.data.data_.v_.ref_count_ =
           (int *)((long)local_848.data.data_.v_.ref_count_ % 1000000000 + 1000000000);
    }
    local_448 = local_848.data.data_.v_.data_;
    ppiStack_440 = (interval **)local_848.data.data_.v_.ref_count_;
  }
  pFVar5 = local_800;
  if ((local_4b8 == 0) && (iVar3 = clock_gettime(4,(timespec *)&local_848), iVar3 == 0)) {
    local_4e8 = local_848.data.data_.v_.data_;
    ppiStack_4e0 = (interval **)local_848.data.data_.v_.ref_count_;
    local_848.data.data_.v_.data_ =
         (interval *)
         ((long)local_4d8 +
         (long)&(local_848.data.data_.v_.data_)->inf +
         (((long)local_848.data.data_.v_.ref_count_ + (long)ppiStack_4d0) / 1000000000 -
         local_4f8.tv_sec));
    local_848.data.data_.v_.ref_count_ =
         (int *)(((long)local_848.data.data_.v_.ref_count_ + (long)ppiStack_4d0) % 1000000000 -
                local_4f8.tv_nsec);
    if ((long)local_848.data.data_.v_.ref_count_ < 0) {
      local_848.data.data_.v_.data_ =
           (interval *)
           ((long)local_848.data.data_.v_.data_ +
           (long)local_848.data.data_.v_.ref_count_ / 1000000000 + -1);
      local_848.data.data_.v_.ref_count_ =
           (int *)((long)local_848.data.data_.v_.ref_count_ % 1000000000 + 1000000000);
    }
    local_4d8 = local_848.data.data_.v_.data_;
    ppiStack_4d0 = (interval **)local_848.data.data_.v_.ref_count_;
  }
  if (pFVar5 != (FILE *)0x0) {
    fclose(pFVar5);
  }
LAB_0010b22a:
  if (bExit == 0) {
    bExit = 1;
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE ObserverThread(void* pParam)
{
	CHRONO chrono;
	CHRONO chrono_v;
	CHRONO chrono_omegaz;
	double dt = 0, t = 0, t0 = 0, t_epoch = 0;
	struct timeval tv;
	//double dt_chrono = 0;
	//interval xhat_prev_old, yhat_prev_old, psihat_prev_old;
	double cosfilteredwinddir = 0, sinfilteredwinddir = 0;
	double lathat = 0, longhat = 0, althat = 0, headinghat = 0, coghat = 0;

	FILE* logstatefile = NULL;
	char logstatefilename[MAX_BUF_LEN];

	UNREFERENCED_PARAMETER(pParam);

	if (!bDisablelogstate)
	{
		EnterCriticalSection(&strtimeCS);
		sprintf(logstatefilename, LOG_FOLDER"logstate_%.64s.csv", strtimeex_fns());
		LeaveCriticalSection(&strtimeCS);
		logstatefile = fopen(logstatefilename, "w");
		if (logstatefile == NULL)
		{
			printf("Unable to create log file.\n");
			if (!bExit) bExit = TRUE; // Unexpected program exit...
			return 0;
		}

		fprintf(logstatefile,
			"t_epoch (in s);lat;lon;alt_amsl;hdg;cog;sog;alt_agl;pressure (in bar);fluiddira (in deg);fluidspeeda;fluiddir (in deg);fluidspeed;range;bearing (in deg);elevation (in deg);utc (in ms);"
			"t_app (in s);xhat;yhat;zhat;phihat;thetahat;psihat;vrxhat;vryhat;vrzhat;omegaxhat;omegayhat;omegazhat;accrxhat;accryhat;accrzhat;"
			"xhat_err;yhat_err;zhat_err;phihat_err;thetahat_err;psihat_err;vrxhat_err;vryhat_err;vrzhat_err;omegaxhat_err;omegayhat_err;omegazhat_err;accrxhat_err;accryhat_err;accrzhat_err;"
			"wx;wy;wz;wphi;wtheta;wpsi;wd;wu;wagl;"
			"uvx;uvy;uvz;uwx;uwy;uwz;u1;u2;u3;u4;u5;u6;u7;u8;u9;u10;u11;u12;u13;u14;"
			"EPU1;EPU2;\n"
		);
		fflush(logstatefile);
	}

	EnterCriticalSection(&StateVariablesCS);
	psitwind = psitwind_med;
	vtwind = vtwind_med;

	// Initialize wind data filter. Should take some time before getting a correct value...
	cosfilteredwinddir = cos(psitwind);
	sinfilteredwinddir = sin(psitwind);
	psitwindhat = fmod_2PI(atan2(sinfilteredwinddir,cosfilteredwinddir));
	vtwindhat = vtwind;
	LeaveCriticalSection(&StateVariablesCS);

	// GPS localization enabled by default, use enable/disableautogpslocalization commands to enable/disable...
	bGPSLocalization = TRUE;

	// DVL localization enabled by default, use enable/disableautodvllocalization commands to enable/disable...
	bDVLLocalization = TRUE;

	t = 0;

	StartChrono(&chrono);
	StartChrono(&chrono_v);
	StartChrono(&chrono_omegaz);

	for (;;)
	{
		uSleep(1000*observerperiod);
		t0 = t;
		GetTimeElapsedChrono(&chrono, &t);
		dt = t-t0;

		//printf("ObserverThread period : %f s.\n", dt);

		if (gettimeofday(&tv, NULL) != EXIT_SUCCESS) { tv.tv_sec = 0; tv.tv_usec = 0; }
		t_epoch = tv.tv_sec+0.000001*tv.tv_usec;
		//utc = 1000.0*tv.tv_sec+0.001*tv.tv_usec;

		EnterCriticalSection(&StateVariablesCS);

		interval xhat_prev = xhat;
		interval yhat_prev = yhat;
		interval zhat_prev = zhat;
		interval psihat_prev = psihat;
		interval vrxhat_prev = vrxhat;
		interval omegazhat_prev = omegazhat;

		vchat = interval(vc_med-vc_var,vc_med+vc_var);
		psichat = interval(psic_med-psic_var,psic_med+psic_var);
		hwhat = interval(-hw_var,hw_var);

		// Wind data filter.
		cosfilteredwinddir = wind_filter_coef*cosfilteredwinddir+(1.0-wind_filter_coef)*cos(psitwind);
		sinfilteredwinddir = wind_filter_coef*sinfilteredwinddir+(1.0-wind_filter_coef)*sin(psitwind);
		psitwindhat = fmod_2PI(atan2(sinfilteredwinddir,cosfilteredwinddir))+interval(-psitwind_var,psitwind_var); // Bounds might go outside modulo...
		vtwindhat = wind_filter_coef*Center(vtwindhat)+(1.0-wind_filter_coef)*vtwind+interval(-vtwind_var,vtwind_var);

		// Temporary...
		switch (psi_source)
		{
		case 2:
			psihat = (sog >= GPS_SOG_for_valid_COG)? psi_dvl: psi_ahrs; // Temp...
			break;
		case 1:
			psihat = (sog >= GPS_SOG_for_valid_COG)? cog_gps: psi_ahrs;
			break;
		case 0:
		default:
			psihat = psi_ahrs;
			break;
		}
		omegaxhat = omegax_ahrs;
		omegayhat = omegay_ahrs;
		//omegazhat = omegaz_ahrs;
		accrxhat = accrx_ahrs;
		accryhat = accry_ahrs;
		accrzhat = accrz_ahrs;

		if (robid & SUBMARINE_ROBID_MASK)
		{
			if ((bDVLLocalization)&&((Width(vrx_dvl) <= 4*dvl_acc)&&(Width(vry_dvl) <= 4*dvl_acc)))
			{
				// State observer using DVL and AHRS data...
				vrxhat = vrx_dvl;
				vryhat = vry_dvl;
				vrzhat = vrz_dvl;
				zhat = z_pressure+hwhat; // Waves influence...
				phihat = phi_ahrs;
				thetahat = theta_ahrs;

				imatrix R_Euler = RotationPhiThetaPsi(phihat, thetahat, psihat);
				box Vr = box(vrxhat, vryhat, vrzhat);
				box pdot = R_Euler*Vr;
				box p = box(xhat, yhat, zhat);
				p = p+dt*pdot;
				xhat = p[1];
				yhat = p[2];

				//imatrix R_Euler = RotationPhiThetaPsi(phihat, thetahat, psihat);
				//box Vr = box(vrxhat, vryhat, vrzhat);
				//rmatrix p = Zeros(3,1);
				//p.SetVal(1, 1, Center(xhat));
				//p.SetVal(2, 1, Center(yhat));
				//p.SetVal(3, 1, Center(zhat));
				//p = p+dt*Center(R_Euler)*rmatrix(Vr);
				//xhat = p.GetVal(1, 1);
				//yhat = p.GetVal(2, 1);
			}
			else
			{
				// State observer (just dead reckoning simulator...).
				xhat = xhat+dt*(vrxhat*Cos(psihat)+vchat*Cos(psichat)+xdotnoise);
				yhat = yhat+dt*(vrxhat*Sin(psihat)+vchat*Sin(psichat)+ydotnoise);
				//zhat = Min(zhat+dt*(u3*alphazhat+vzuphat+zdotnoise),interval(0.0)); // z always negative.
				//zhat = zhat & (z_pressure+hwhat);
				zhat = z_pressure+hwhat; // Waves influence...
				//psihat = psihat+dt*((u1-u2)*alphaomegazhat+psidotnoise);
				phihat = phi_ahrs;
				thetahat = theta_ahrs;
				vrxhat = (
					(1.0-dt*alphafvrxhat)*vrxhat
					+dt*(u1+u2)*alphavrxhat
					+dt*vrxdotnoise
					); // Factorization.
				// Should add vc,psic estimation influence in v?
			}

			// SAUC'ISSE, SARDINE, BLUEROV, LIRMIA3 can measure omegaz.
			if ((robid & SAUCISSE_CLASS_ROBID_MASK)||(robid == BLUEROV_ROBID)||(robid == LIRMIA3_ROBID))
			{
				omegazhat = omegaz_ahrs;
			}
			else if (robid == SUBMARINE_SIMULATOR_ROBID)
			{
				omegazhat = dt*((u1-u2)*alphaomegazhat+psidotnoise); // Why dt*...???

				//omegazhat = (
				//	(1.0-dt*alphafomegazhat)*omegazhat
				//	+dt*(u1-u2)*alphaomegazhat
				//	+dt*omegazdotnoise
				//	); // Factorization.
			}
			else
			{
				// To handle modulo 2pi problems, we should use the following :
				//omegazhat = sin(Center(psihat)-Center(psihat_prev))/dt+interval(-omegaz_ahrs_acc,+omegaz_ahrs_acc);

				//GetTimeElapsedChrono(&chrono_omegaz, &dt_chrono);
				//if (dt_chrono > 0.5)
				//{
				//	omegazhat = sin(Center(psihat)-Center(psihat_prev_old))/dt_chrono+interval(-omegaz_ahrs_acc,+omegaz_ahrs_acc);
				//	StopChronoQuick(&chrono_omegaz);
				//	StartChrono(&chrono_omegaz);
				//	psihat_prev_old = psihat;
				//}
				omegazhat = 0.8*omegazhat+0.2*(sin(Center(psihat)-Center(psihat_prev))/dt+interval(-omegaz_ahrs_acc,+omegaz_ahrs_acc));

				//printf("omegazhat = %f\n", Center(omegazhat));
			}
			if ((bGPSLocalization)&&(bCheckGNSSOK())&&(Center(zhat) > GPS_submarine_depth_limit))
			{
				// Should add speed...?
				xhat = xhat & x_gps;
				yhat = yhat & y_gps;
				if (xhat.isEmpty || yhat.isEmpty)
				{
					xhat = x_gps;
					yhat = y_gps;
				}
			}
		}
		else if (robid == ETAS_WHEEL_ROBID)
		{
			xhat = xhat+dt*(alphavrxhat*(u1+u2)*Cos(psihat)+xdotnoise);
			yhat = yhat+dt*(alphavrxhat*(u1+u2)*Sin(psihat)+ydotnoise);
			zhat = interval(-5*GPS_low_acc,5*GPS_low_acc);
			phihat = phi_ahrs;
			thetahat = theta_ahrs;
			vrxhat = sqrt(sqr(Center(xhat-xhat_prev))+sqr(Center(yhat-yhat_prev)))/dt+vrxdotnoise;
			omegazhat = omegaz_ahrs;
			if ((bGPSLocalization)&&(bCheckGNSSOK()))
			{
				// Should add speed...?
				xhat = xhat & x_gps;
				yhat = yhat & y_gps;
				zhat = zhat & z_gps;
				if (xhat.isEmpty || yhat.isEmpty)
				{
					xhat = x_gps;
					yhat = y_gps;
				}
				if (zhat.isEmpty) zhat = z_gps;
			}
		}
		else if (robid == BUBBLE_ROBID)
		{
			//// Temp...
			//xhat = xhat+dt*(vrxhat*Cos(psihat)+vchat*Cos(psichat)+xdotnoise);
			//yhat = yhat+dt*(vrxhat*Sin(psihat)+vchat*Sin(psichat)+ydotnoise);
			//zhat = interval(-5*GPS_low_acc,5*GPS_low_acc);
			//vrxhat = (
			//	(1.0-dt*alphafvrxhat)*vrxhat
			//	+dt*(u1+u2)*alphavrxhat
			//	+dt*vrxdotnoise
			//	); // Factorization.
			//// Should add vc,psic estimation influence in v?
			//omegazhat = interval(omegaz_mes-omegaz_ahrs_acc,omegaz_mes+omegaz_ahrs_acc);

			xhat = x_gps;
			yhat = y_gps;
			zhat = z_gps;
			phihat = phi_ahrs;
			thetahat = theta_ahrs;
			vrxhat = sqrt(sqr(Center(xhat-xhat_prev))+sqr(Center(yhat-yhat_prev)))/dt+vrxdotnoise;
			omegazhat = omegaz_ahrs;

			//GetTimeElapsedChrono(&chrono_v, &dt_chrono);
			//if (dt_chrono > 1)
			//{
			//	vrxhat = sqrt(sqr(Center(xhat-xhat_prev_old))+sqr(Center(yhat-yhat_prev_old)))/dt_chrono+vrxdotnoise;
			//	StopChronoQuick(&chrono_v);
			//	StartChrono(&chrono_v);
			//	xhat_prev_old = xhat;
			//	yhat_prev_old = yhat;
			//}
			//vrxhat = 0.9*vrxhat+0.1*(sqrt(sqr(Center(xhat-xhat_prev))+sqr(Center(yhat-yhat_prev)))/dt+vrxdotnoise);
			//printf("vrxhat = %f\n", Center(vrxhat));
		}
		else if ((robid == BUGGY_SIMULATOR_ROBID)||(robid == BUGGY_ROBID))
		{
			xhat = xhat+dt*(alphavrxhat*u_f*Cos(psihat)*Cos(alphaomegazhat*uw_f)+xdotnoise);
			yhat = yhat+dt*(alphavrxhat*u_f*Sin(psihat)*Cos(alphaomegazhat*uw_f)+ydotnoise);
			zhat = interval(-5*GPS_low_acc,5*GPS_low_acc);
			phihat = phi_ahrs;
			thetahat = theta_ahrs;
			vrxhat = sqrt(sqr(Center(xhat-xhat_prev))+sqr(Center(yhat-yhat_prev)))/dt+vrxdotnoise;
			omegazhat = omegaz_ahrs;
			if ((bGPSLocalization)&&(bCheckGNSSOK()))
			{
				// Should add speed...?
				xhat = xhat & x_gps;
				yhat = yhat & y_gps;
				zhat = zhat & z_gps;
				if (xhat.isEmpty || yhat.isEmpty)
				{
					xhat = x_gps;
					yhat = y_gps;
				}
				if (zhat.isEmpty) zhat = z_gps;
			}
		}
		else if ((robid == MOTORBOAT_SIMULATOR_ROBID)||(robid == MOTORBOAT_ROBID))
		{
			//// Temp...
			//xhat = xhat+dt*(alphavrxhat*u_f*Cos(psihat)*Cos(alphaomegazhat*uw_f)+xdotnoise);
			//yhat = yhat+dt*(alphavrxhat*u_f*Sin(psihat)*Cos(alphaomegazhat*uw_f)+ydotnoise);
			//zhat = interval(-5*GPS_low_acc,5*GPS_low_acc);
			//vrxhat = sqrt(sqr(Center(xhat-xhat_prev))+sqr(Center(yhat-yhat_prev)))/dt+vrxdotnoise;
			//omegazhat = interval(omegaz_mes-omegaz_ahrs_acc,omegaz_mes+omegaz_ahrs_acc);

			xhat = x_gps;
			yhat = y_gps;
			zhat = z_gps;
			phihat = phi_ahrs;
			thetahat = theta_ahrs;
			vrxhat = sqrt(sqr(Center(xhat-xhat_prev))+sqr(Center(yhat-yhat_prev)))/dt+vrxdotnoise;
			omegazhat = omegaz_ahrs;

			//GetTimeElapsedChrono(&chrono_v, &dt_chrono);
			//if (dt_chrono > 1)
			//{
			//	vrxhat = sqrt(sqr(Center(xhat-xhat_prev_old))+sqr(Center(yhat-yhat_prev_old)))/dt_chrono+vrxdotnoise;
			//	StopChronoQuick(&chrono_v);
			//	StartChrono(&chrono_v);
			//	xhat_prev_old = xhat;
			//	yhat_prev_old = yhat;
			//}
			//vrxhat = 0.9*vrxhat+0.1*(sqrt(sqr(Center(xhat-xhat_prev))+sqr(Center(yhat-yhat_prev)))/dt+vrxdotnoise);
			//printf("vrxhat = %f\n", Center(vrxhat));
		}
		else if (robid == ARDUCOPTER_ROBID)
		{
			vrxhat = vrx_of;
			vryhat = vry_of;
			xhat = xhat+dt*(vrx_of*Cos(psihat)-vry_of*Sin(psihat)+xdotnoise);
			yhat = yhat+dt*(vrx_of*Sin(psihat)+vry_of*Cos(psihat)+ydotnoise);
			zhat = interval(-5*GPS_low_acc,5*GPS_low_acc);
			phihat = phi_ahrs;
			thetahat = theta_ahrs;
			//vrxhat = sqrt(sqr(Center(xhat-xhat_prev))+sqr(Center(yhat-yhat_prev)))/dt+vrxdotnoise;
			vrzhat = (Center(zhat-zhat_prev))/dt+vrzdotnoise;
			omegazhat = omegaz_ahrs;
			if ((bGPSLocalization)&&(bCheckGNSSOK()))
			{
				// Should add speed...?
				xhat = xhat & x_gps;
				yhat = yhat & y_gps;
				zhat = zhat & z_gps;
				if (xhat.isEmpty || yhat.isEmpty)
				{
					xhat = x_gps;
					yhat = y_gps;
				}
				if (zhat.isEmpty) zhat = z_gps;
			}
		}
		else
		{
			xhat = x_gps;
			yhat = y_gps;
			zhat = z_gps;
			phihat = phi_ahrs;
			thetahat = theta_ahrs;
			vrxhat = sqrt(sqr(Center(xhat-xhat_prev))+sqr(Center(yhat-yhat_prev)))/dt+vrxdotnoise;
			omegazhat = omegaz_ahrs;

			//GetTimeElapsedChrono(&chrono_v, &dt_chrono);
			//if (dt_chrono > 1)
			//{
			//	vrxhat = sqrt(sqr(Center(xhat-xhat_prev_old))+sqr(Center(yhat-yhat_prev_old)))/dt_chrono+vrxdotnoise;
			//	StopChronoQuick(&chrono_v);
			//	StartChrono(&chrono_v);
			//	xhat_prev_old = xhat;
			//	yhat_prev_old = yhat;
			//}
			//vrxhat = 0.9*vrxhat+0.1*(sqrt(sqr(Center(xhat-xhat_prev))+sqr(Center(yhat-yhat_prev)))/dt+vrxdotnoise);
			//printf("vrxhat = %f\n", Center(vrxhat));
		}

		EnvCoordSystem2GPS(lat_env, long_env, alt_env, angle_env, Center(xhat), Center(yhat), Center(zhat), &lathat, &longhat, &althat);
		headinghat = fmod_360_pos_rad2deg(-angle_env-Center(psihat)+M_PI/2.0);
		coghat = fmod_360_pos_rad2deg(-angle_env-Center(cog_gps)+M_PI/2.0);

		switch (robid)
		{
		case SUBMARINE_SIMULATOR_ROBID:
		case SAUCISSE_ROBID:
		case SARDINE_ROBID:
		case CISCREA_ROBID:
			if (vbat1 != 0) EPU1 += dt*(vbat1_filtered*ibat1_filtered)/3600.0;
			else EPU1 += dt*(P_electronics_4)/3600.0;
			if (vbat2 != 0) EPU2 += dt*(vbat2_filtered*ibat2_filtered)/3600.0;
			else EPU2 += dt*((u1+u2+u3)*P_actuators_1+P_actuators_4)/3600.0;
			break;
		case VAIMOS_ROBID:
			if (vbat1 != 0) EPU1 += dt*(vbat1_filtered*ibat1_filtered)/3600.0;
			else EPU1 += dt*(P_electronics_4+P_actuators_4)/3600.0;
			break;
		case SAILBOAT_SIMULATOR_ROBID:
		case SAILBOAT_ROBID:
		case SAILBOAT2_ROBID:
			if (vbat1 != 0) EPU1 += dt*(vbat1_filtered*ibat1_filtered)/3600.0;
			else EPU1 += dt*(P_electronics_4)/3600.0;
			if (vbat2 != 0) EPU2 += dt*(vbat2_filtered*ibat2_filtered)/3600.0;
			else EPU2 += dt*(P_actuators_4)/3600.0;
			break;
		case MOTORBOAT_SIMULATOR_ROBID:
		case MOTORBOAT_ROBID:
		case BUGGY_SIMULATOR_ROBID:
		case BUGGY_ROBID:
			if (vbat1 != 0) EPU1 += dt*(vbat1_filtered*ibat1_filtered)/3600.0;
			else EPU1 += dt*(P_electronics_4)/3600.0;
			if (vbat2 != 0) EPU2 += dt*(vbat2_filtered*ibat2_filtered)/3600.0;
			else EPU2 += dt*(u_f*P_actuators_1+uw_f*P_actuators_2+P_actuators_4)/3600.0;
			break;
		case BUBBLE_ROBID:
		case TANK_SIMULATOR_ROBID:
		case ETAS_WHEEL_ROBID:
			if (vbat1 != 0) EPU1 += dt*(vbat1_filtered*ibat1_filtered)/3600.0;
			else EPU1 += dt*(P_electronics_4)/3600.0;
			if (vbat2 != 0) EPU2 += dt*(vbat2_filtered*ibat2_filtered)/3600.0;
			else EPU2 += dt*((u1+u2)*P_actuators_1+P_actuators_4)/3600.0;
			break;
		case QUADRO_SIMULATOR_ROBID:
		case COPTER_ROBID:
		case ARDUCOPTER_ROBID:
		default:
			if (vbat1 != 0) EPU1 += dt*(vbat1_filtered*ibat1_filtered)/3600.0;
			else EPU1 += dt*(P_electronics_4)/3600.0;
			if (vbat2 != 0) EPU2 += dt*(vbat2_filtered*ibat2_filtered)/3600.0;
			else EPU2 += dt*((u_f+uw_f+uv_f+ul_f)*P_actuators_1+P_actuators_4)/3600.0;
			break;
		}

		switch (robid)
		{
		case VAIMOS_ROBID:
		case SAILBOAT_ROBID:
		case SAILBOAT2_ROBID:
		case MOTORBOAT_ROBID:
		case BUBBLE_ROBID:
			fluiddira = fmod_360_rad2deg(M_PI/2-psiawind);
			fluidspeeda = vawind;
			fluiddir = fmod_360_rad2deg(M_PI/2-Center(psitwindhat));
			fluidspeed = Center(vtwindhat);
			break;
		case QUADRO_SIMULATOR_ROBID:
		case COPTER_ROBID:
		case ARDUCOPTER_ROBID:
		default:
			break;
		}

		if (logstatefile)
		{
			fprintf(logstatefile,
				"%f;%.8f;%.8f;%.3f;%.2f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;"
				"%f;%.3f;%.3f;%.3f;%f;%f;%f;"
				"%f;%f;%f;%f;%f;%f;%f;%f;%f;"
				"%.3f;%.3f;%.3f;%f;%f;%f;"
				"%f;%f;%f;%f;%f;%f;%f;%f;%f;"
				"%f;%f;%f;%f;%f;%f;%f;%f;%f;"
				"%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;"
				"%.3f;%.3f;\n",
				t_epoch, lathat, longhat, althat, headinghat, coghat, sog, altitude_AGL, pressure_mes, fluiddira, fluidspeeda, fluiddir, fluidspeed, d_mes, fmod_360_rad2deg(alpha_mes), 0.0, utc,
				t, Center(xhat), Center(yhat), Center(zhat), Center(phihat), Center(thetahat), Center(psihat),
				Center(vrxhat), Center(vryhat), Center(vrzhat), Center(omegaxhat), Center(omegayhat), Center(omegazhat), Center(accrxhat), Center(accryhat), Center(accrzhat),
				Width(xhat/2.0), Width(yhat/2.0), Width(zhat/2.0), Width(phihat/2.0), Width(thetahat/2.0), Width(psihat/2.0),
				Width(vrxhat/2.0), Width(vryhat/2.0), Width(vrzhat/2.0), Width(omegaxhat/2.0), Width(omegayhat/2.0), Width(omegazhat/2.0), Width(accrxhat/2.0), Width(accryhat/2.0), Width(accrzhat/2.0),
				wx, wy, wz, wphi, wtheta, wpsi, wd, wu, wagl,
				u_f, ul_f, uv_f, ur_f, up_f, uw_f, u1, u2, u3, u4, u5, u6, u7, u8, u9, u10, u11, u12, u13, u14,
				EPU1, EPU2);
			fflush(logstatefile);
		}

		LeaveCriticalSection(&StateVariablesCS);

		if (bExit) break;
	}

	StopChronoQuick(&chrono_omegaz);
	StopChronoQuick(&chrono_v);
	StopChrono(&chrono, &t);

	if (logstatefile)
	{
		fclose(logstatefile);
	}

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}